

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_xchannel_add_message(share_xchannel *xc,int type,void *data,int len)

{
  share_xchannel_message *psVar1;
  share_xchannel_message *msg;
  int len_local;
  void *data_local;
  int type_local;
  share_xchannel *xc_local;
  
  psVar1 = (share_xchannel_message *)safemalloc(1,0x20,(long)len);
  psVar1->data = (uchar *)(psVar1 + 1);
  psVar1->datalen = len;
  psVar1->type = type;
  memcpy(psVar1->data,data,(long)len);
  if (xc->msgtail == (share_xchannel_message *)0x0) {
    xc->msghead = psVar1;
  }
  else {
    xc->msgtail->next = psVar1;
  }
  psVar1->next = (share_xchannel_message *)0x0;
  xc->msgtail = psVar1;
  return;
}

Assistant:

static void share_xchannel_add_message(
    struct share_xchannel *xc, int type, const void *data, int len)
{
    struct share_xchannel_message *msg;

    /*
     * Allocate the 'struct share_xchannel_message' and the actual
     * data in one unit.
     */
    msg = snew_plus(struct share_xchannel_message, len);
    msg->data = snew_plus_get_aux(msg);
    msg->datalen = len;
    msg->type = type;
    memcpy(msg->data, data, len);

    /*
     * Queue it in the xchannel.
     */
    if (xc->msgtail)
        xc->msgtail->next = msg;
    else
        xc->msghead = msg;
    msg->next = NULL;
    xc->msgtail = msg;
}